

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

VP8LHistogram * VP8LAllocateHistogram(int cache_bits)

{
  int iVar1;
  VP8LHistogram *h;
  
  iVar1 = (4 << ((byte)cache_bits & 0x1f)) + 0x1150;
  if (cache_bits < 1) {
    iVar1 = 0x1150;
  }
  h = (VP8LHistogram *)WebPSafeMalloc((long)iVar1,1);
  if (h != (VP8LHistogram *)0x0) {
    h->literal = (uint32_t *)(h + 1);
    h->palette_code_bits = cache_bits;
    HistogramStatsClear(h);
  }
  return h;
}

Assistant:

VP8LHistogram* VP8LAllocateHistogram(int cache_bits) {
  VP8LHistogram* histo = NULL;
  const int total_size = GetHistogramSize(cache_bits);
  uint8_t* const memory = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*memory));
  if (memory == NULL) return NULL;
  histo = (VP8LHistogram*)memory;
  // 'literal' won't necessary be aligned.
  histo->literal = (uint32_t*)(memory + sizeof(VP8LHistogram));
  VP8LHistogramInit(histo, cache_bits, /*init_arrays=*/ 0);
  return histo;
}